

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseCompiler::setStackSize
          (BaseCompiler *this,uint32_t virtId,uint32_t newSize,uint32_t newAlignment)

{
  long lVar1;
  Error EVar2;
  VirtReg *pVVar3;
  VirtReg VVar4;
  
  if (virtId - 0x100 < *(uint *)&this->field_0x1f0) {
    if ((newAlignment & newAlignment - 1) != 0) {
      EVar2 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
      return EVar2;
    }
    VVar4 = (VirtReg)0x40;
    if (newAlignment < 0x40) {
      VVar4 = SUB41(newAlignment,0);
    }
    pVVar3 = virtRegById(this,virtId);
    if (newSize != 0) {
      *(uint32_t *)(pVVar3 + 8) = newSize;
    }
    if (newAlignment != 0) {
      pVVar3[0xc] = VVar4;
    }
    EVar2 = 0;
    if ((*(long *)(pVVar3 + 0x28) != 0) &&
       (lVar1 = *(long *)(*(long *)(pVVar3 + 0x28) + 0x18), lVar1 != 0)) {
      *(undefined4 *)(lVar1 + 4) = *(undefined4 *)(pVVar3 + 8);
      *(VirtReg *)(lVar1 + 1) = pVVar3[0xc];
      EVar2 = 0;
    }
  }
  else {
    EVar2 = 0x1e;
  }
  return EVar2;
}

Assistant:

Error BaseCompiler::setStackSize(uint32_t virtId, uint32_t newSize, uint32_t newAlignment) {
  if (!isVirtIdValid(virtId))
    return DebugUtils::errored(kErrorInvalidVirtId);

  if (newAlignment && !Support::isPowerOf2(newAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (newAlignment > 64)
    newAlignment = 64;

  VirtReg* vReg = virtRegById(virtId);
  if (newSize)
    vReg->_virtSize = newSize;

  if (newAlignment)
    vReg->_alignment = uint8_t(newAlignment);

  // This is required if the RAPass is already running. There is a chance that a stack-slot has been already
  // allocated and in that case it has to be updated as well, otherwise we would allocate wrong amount of memory.
  RAWorkReg* workReg = vReg->_workReg;
  if (workReg && workReg->_stackSlot) {
    workReg->_stackSlot->_size = vReg->_virtSize;
    workReg->_stackSlot->_alignment = vReg->_alignment;
  }

  return kErrorOk;
}